

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

void trb_print_subtree_nodes
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_parent_cache ca,
               trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  undefined8 uVar1;
  lysp_node *plVar2;
  bool bVar3;
  bool bVar4;
  trt_wrapper wr_00;
  trt_wrapper wr_01;
  trt_wrapper wr_02;
  trt_wrapper wr_03;
  undefined8 uVar5;
  ly_bool lVar6;
  ly_bool lVar7;
  LY_ERR LVar8;
  uint32_t uVar9;
  void *pvVar10;
  lyplg_ext_sprinter_ctree_override_clb p_Var11;
  lysp_node_list *plVar12;
  long lVar13;
  lysp_node_list *plVar14;
  trt_tree_ctx *ptVar15;
  trt_printer_ctx *ptVar16;
  undefined8 *puVar17;
  trt_node *ptVar18;
  trt_node *ptVar19;
  lyplg_ext_sprinter_ctree_override_clb i_00;
  bool bVar20;
  byte bVar21;
  trt_parent_cache ca_00;
  trt_parent_cache tVar22;
  trt_parent_cache tVar23;
  trt_parent_cache ca_01;
  trt_parent_cache ca_02;
  trt_parent_cache ca_03;
  trt_parent_cache ca_04;
  trt_parent_cache ca_05;
  trt_parent_cache ca_06;
  trt_parent_cache tVar24;
  ly_bool ignore;
  uint32_t max_gap_before_type_1;
  uint64_t i;
  lyspr_tree_ctx plug_ctx;
  trt_printer_ctx pc_dupl;
  ly_bool local_1f5;
  uint32_t local_1f4;
  undefined8 local_1f0;
  undefined8 local_1e8;
  lyspr_tree_schema *local_1e0;
  lysp_node_list *local_1d8;
  lysp_node_list *local_1d0;
  uint64_t local_1c8;
  uint64_t local_1c0;
  uint64_t local_1b8;
  undefined4 local_1ac;
  lyspr_tree_ctx local_1a8;
  void *local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  char *local_170;
  char *pcStack_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  trt_type_type local_150;
  char *local_148;
  trt_iffeatures_type local_140;
  char *local_138;
  ly_bool local_130;
  undefined1 local_118 [16];
  ulong uStack_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  trt_node local_f8;
  undefined8 local_90 [12];
  
  plVar12 = ca.last_list;
  local_1e8 = ca._0_8_;
  bVar21 = 0;
  local_1f0 = CONCAT44(local_1f0._4_4_,max_gap_before_type);
  local_1d8 = plVar12;
  if (((((node->iffeatures).type == TRD_IFF_NON_PRESENT) && ((node->type).type == TRD_TYPE_EMPTY))
      && ((node->name).str == (char *)0x0)) &&
     ((node->flags == (char *)0x0 && (node->status == (char *)0x0)))) {
    (*(pc->fp).modify.first_sibling)((trt_node *)local_188,ca,tc);
    ptVar18 = (trt_node *)local_188;
    ptVar19 = node;
    for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
      ptVar19->status = ptVar18->status;
      ptVar18 = (trt_node *)((long)ptVar18 + (ulong)bVar21 * -0x10 + 8);
      ptVar19 = (trt_node *)((long)ptVar19 + (ulong)bVar21 * -0x10 + 8);
    }
    goto LAB_0019849d;
  }
  trb_print_entire_node(node,max_gap_before_type,wr,pc,tc);
  lVar6 = tc->lysc_tree;
  if (((lVar6 == '\0') || (pvVar10 = trp_ext_is_present(lVar6,tc->cn), pvVar10 == (void *)0x0)) &&
     (pvVar10 = trp_ext_is_present(lVar6,tc->pn), pvVar10 == (void *)0x0)) goto LAB_00198391;
  local_118._0_8_ = wr._0_8_;
  local_1b8 = wr.bit_marks1;
  local_1e0 = (lyspr_tree_schema *)(ulong)wr.actual_pos;
  local_1ac = wr._20_4_;
  local_1f5 = '\0';
  local_1f4 = 0;
  tVar24.last_list = plVar12;
  tVar24.ancestor = (undefined4)local_1e8;
  tVar24.lys_status = local_1e8._4_2_;
  tVar24.lys_config = local_1e8._6_2_;
  tVar24 = tro_parent_cache_for_child(tVar24,tc);
  local_1d0 = tVar24.last_list;
  local_1f0 = tVar24._0_8_;
  lVar6 = (*(pc->fp).read.if_parent_exists)(tc);
  lVar7 = (*(pc->fp).read.if_sibling_exists)(tc);
  if (lVar6 == '\0' && lVar7 == '\0') {
    if ((tc->plugin_ctx).last_schema == '\0') goto LAB_00197fad;
LAB_00197fd2:
    if (0x3f < (uint)local_1e0) goto LAB_00198722;
  }
  else {
    if (lVar6 != '\0' && lVar7 == '\0') goto LAB_00197fd2;
LAB_00197fad:
    if (0x3f < (uint)local_1e0) goto LAB_00198703;
    local_1b8 = local_1b8 | 1L << ((ulong)local_1e0 & 0x3f);
  }
  local_190 = tro_next_child((&tc->pn)[(ulong)(tc->lysc_tree != '\0') * 2],tc);
  local_1c0 = 0;
  pvVar10 = trb_ext_iter(tc,&local_1c0);
  if (pvVar10 == (void *)0x0) {
    local_1c8 = 0xffffffffffffffff;
  }
  else {
    local_1c8 = 0xffffffffffffffff;
    do {
      local_188._0_8_ = (lyspr_tree_schema *)0x0;
      local_188._8_8_ = (lysp_node_list *)0x0;
      local_178 = (_func_void_void_ptr *)0x0;
      LVar8 = tro_ext_printer_tree(tc->lysc_tree,pvVar10,(lyspr_tree_ctx *)local_188,&local_1f5);
      if (LVar8 != LY_SUCCESS) goto LAB_0019838d;
      if (local_1f5 == '\0') {
        ca_00.last_list = local_1d0;
        ca_00.ancestor = (uint32_t)local_1f0;
        ca_00.lys_status = local_1f0._4_2_;
        ca_00.lys_config = local_1f0._6_2_;
        trb_ext_try_unified_indent((lyspr_tree_ctx *)local_188,ca_00,&local_1f4,pc,tc);
        if ((lyspr_tree_schema *)local_188._0_8_ != (lyspr_tree_schema *)0x0) {
          local_1c8 = local_1c0;
          free(&((lyspr_tree_schema *)(local_188._0_8_ + -0x18))->field_2);
        }
        if (local_178 != (_func_void_void_ptr *)0x0) {
          (*local_178)((void *)local_188._8_8_);
        }
      }
      else {
        local_1f5 = '\0';
      }
      pvVar10 = trb_ext_iter(tc,&local_1c0);
    } while (pvVar10 != (void *)0x0);
  }
  plVar14 = local_1d0;
  uVar1 = local_1f0;
  if (local_190 != (void *)0x0) {
    tVar22.last_list = local_1d0;
    tVar22.ancestor = (uint32_t)local_1f0;
    tVar22.lys_status = local_1f0._4_2_;
    tVar22.lys_config = local_1f0._6_2_;
    (*(pc->fp).modify.next_child)((trt_node *)local_188,tVar22,tc);
    plVar12 = local_1d8;
    uVar5 = local_1f0;
    ca_01.last_list = plVar14;
    local_1f0._0_4_ = (uint32_t)uVar1;
    local_1f0._4_2_ = SUB82(uVar1,4);
    local_1f0._6_2_ = SUB82(uVar1,6);
    ca_01.ancestor = (uint32_t)local_1f0;
    ca_01.lys_status = local_1f0._4_2_;
    ca_01.lys_config = local_1f0._6_2_;
    local_1f0 = uVar5;
    uVar9 = trb_max_gap_to_type(ca_01,pc,tc);
    if (local_1f4 < uVar9) {
      local_1f4 = uVar9;
    }
    (*(pc->fp).modify.parent)(tc);
  }
  local_1c0 = 0;
  pvVar10 = trb_ext_iter(tc,&local_1c0);
  if (pvVar10 != (void *)0x0) {
    local_1e0 = (lyspr_tree_schema *)(ulong)((int)local_1e0 + 1);
    do {
      local_1a8.schemas = (lyspr_tree_schema *)0x0;
      local_1a8.plugin_priv = (void *)0x0;
      local_1a8.free_plugin_priv = (_func_void_void_ptr *)0x0;
      LVar8 = tro_ext_printer_tree(tc->lysc_tree,pvVar10,&local_1a8,&local_1f5);
      uVar9 = local_1f4;
      if (LVar8 != LY_SUCCESS) goto LAB_0019838d;
      if (local_1f5 == '\0') {
        bVar3 = local_1c0 == local_1c8;
        bVar4 = local_190 == (void *)0x0;
        local_118._8_8_ = local_118._0_8_;
        uStack_108 = local_1b8;
        local_100 = (int)local_1e0;
        uStack_fc = local_1ac;
        ptVar15 = tc;
        puVar17 = (undefined8 *)local_188;
        for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar17 = *(undefined8 *)ptVar15;
          ptVar15 = (trt_tree_ctx *)((long)ptVar15 + (ulong)bVar21 * -0x10 + 8);
          puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        }
        ptVar16 = pc;
        puVar17 = local_90;
        for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar17 = ptVar16->out;
          ptVar16 = (trt_printer_ctx *)((long)ptVar16 + (ulong)bVar21 * -0x10 + 8);
          puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        }
        if (local_1a8.schemas != (lyspr_tree_schema *)0x0) {
          i_00 = (lyplg_ext_sprinter_ctree_override_clb)0x0;
LAB_0019822a:
          if (i_00 < local_1a8.schemas[-1].field_2.cn_overr) goto code_r0x00198234;
          puVar17 = local_90;
          ptVar16 = pc;
          for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
            ptVar16->out = (ly_out *)*puVar17;
            puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
            ptVar16 = (trt_printer_ctx *)((long)ptVar16 + (ulong)bVar21 * -0x10 + 8);
          }
          free(&local_1a8.schemas[-1].field_2);
          goto LAB_0019834f;
        }
LAB_0019831b:
        puVar17 = local_90;
        ptVar16 = pc;
        for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
          ptVar16->out = (ly_out *)*puVar17;
          puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
          ptVar16 = (trt_printer_ctx *)((long)ptVar16 + (ulong)bVar21 * -0x10 + 8);
        }
LAB_0019834f:
        plVar12 = local_1d8;
        if (local_1a8.free_plugin_priv != (_func_void_void_ptr *)0x0) {
          (*local_1a8.free_plugin_priv)(local_1a8.plugin_priv);
        }
      }
      else {
        local_1f5 = '\0';
      }
      pvVar10 = trb_ext_iter(tc,&local_1c0);
    } while (pvVar10 != (void *)0x0);
  }
LAB_00198391:
  lVar6 = (*(pc->fp).read.if_parent_exists)(tc);
  lVar7 = (*(pc->fp).read.if_sibling_exists)(tc);
  if (lVar6 == '\0' && lVar7 == '\0') {
    if ((tc->plugin_ctx).last_schema == '\0') goto LAB_001983b7;
LAB_001983e0:
    if (0x3f < wr.actual_pos) {
LAB_00198722:
      __assert_fail("wr.actual_pos < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                    ,0x3a6,"struct trt_wrapper trp_wrapper_set_shift(struct trt_wrapper)");
    }
  }
  else {
    if (lVar6 != '\0' && lVar7 == '\0') goto LAB_001983e0;
LAB_001983b7:
    if (0x3f < wr.actual_pos) {
LAB_00198703:
      __assert_fail("wr.actual_pos < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                    ,0x3b7,"struct trt_wrapper trp_wrapper_set_mark(struct trt_wrapper)");
    }
    wr.bit_marks1 = wr.bit_marks1 | 1L << ((byte)wr.actual_pos & 0x3f);
  }
  wr.actual_pos = wr.actual_pos + 1;
  ca_02.last_list = plVar12;
  ca_02.ancestor = (undefined4)local_1e8;
  ca_02.lys_status = local_1e8._4_2_;
  ca_02.lys_config = local_1e8._6_2_;
  tVar24 = tro_parent_cache_for_child(ca_02,tc);
  local_1e8 = tVar24._0_8_;
  (*(pc->fp).modify.next_child)((trt_node *)local_188,tVar24,tc);
  ptVar18 = (trt_node *)local_188;
  ptVar19 = node;
  for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
    ptVar19->status = ptVar18->status;
    ptVar18 = (trt_node *)((long)ptVar18 + (ulong)bVar21 * -0x10 + 8);
    ptVar19 = (trt_node *)((long)ptVar19 + (ulong)bVar21 * -0x10 + 8);
  }
  if ((((node->iffeatures).type == TRD_IFF_NON_PRESENT) && ((node->type).type == TRD_TYPE_EMPTY)) &&
     (((node->name).str == (char *)0x0 &&
      ((node->flags == (char *)0x0 && (node->status == (char *)0x0)))))) {
    return;
  }
  ca_03.last_list = tVar24.last_list;
  ca_03.ancestor = (undefined4)local_1e8;
  ca_03.lys_status = local_1e8._4_2_;
  ca_03.lys_config = local_1e8._6_2_;
  uVar9 = trb_max_gap_to_type(ca_03,pc,tc);
  local_1f0 = CONCAT44(local_1f0._4_4_,uVar9);
  local_1d8 = tVar24.last_list;
LAB_0019849d:
  plVar12 = local_1d8;
  do {
    if ((tc->plugin_ctx).filtered == '\0') {
      if (tc->lysc_tree == '\0') {
        plVar2 = tc->pn->parent;
        if (((plVar2 != (lysp_node *)0x0) && ((plVar2->nodetype & 2) != 0)) &&
           ((tc->pn->nodetype & 0x6f) != 0)) {
          local_1e0 = (lyspr_tree_schema *)wr._0_8_;
          local_1d0 = (lysp_node_list *)wr.bit_marks1;
          local_1c8 = CONCAT44(local_1c8._4_4_,wr._20_4_);
          local_188._0_8_ = node->status;
          local_188._8_8_ = "--";
          local_178._0_5_ = CONCAT14((node->name).keys,TRD_NODE_CASE);
          local_170 = (node->name).module_prefix;
          pcStack_168 = (node->name).str;
          local_160 = *(undefined4 *)&(node->name).add_opts;
          uStack_15c = *(undefined4 *)((long)&(node->name).add_opts + 4);
          uStack_158 = *(undefined4 *)&(node->name).opts;
          uStack_154 = *(undefined4 *)((long)&(node->name).opts + 4);
          local_150 = TRD_TYPE_EMPTY;
          local_148 = (char *)0x0;
          local_140 = TRD_IFF_NON_PRESENT;
          local_138 = (char *)0x0;
          local_130 = node->last_one;
          ly_print_(pc->out,"\n");
          wr_02._20_4_ = wr._20_4_;
          wr_02.actual_pos = wr.actual_pos;
          wr_02.bit_marks1 = wr.bit_marks1;
          wr_02.type = wr.type;
          wr_02._4_4_ = wr._4_4_;
          trb_print_entire_node((trt_node *)local_188,0,wr_02,pc,tc);
          ly_print_(pc->out,"\n");
          lVar6 = (*(pc->fp).read.if_sibling_exists)(tc);
          plVar12 = local_1d8;
          if (lVar6 == '\0') {
            plVar14 = local_1d0;
            if (0x3f < wr.actual_pos) goto LAB_00198722;
          }
          else {
            if (0x3f < wr.actual_pos) goto LAB_00198703;
            plVar14 = (lysp_node_list *)((ulong)local_1d0 | 1L << ((ulong)wr.actual_pos & 0x3f));
          }
          local_188._0_8_ = local_1e0;
          local_178 = (_func_void_void_ptr *)CONCAT44((undefined4)local_1c8,wr.actual_pos + 1);
          wr_03.bit_marks1 = (uint64_t)plVar14;
          wr_03._0_8_ = local_1e0;
          wr_03._16_8_ = local_178;
          ca_06.last_list = local_1d8;
          ca_06.ancestor = (undefined4)local_1e8;
          ca_06.lys_status = local_1e8._4_2_;
          ca_06.lys_config = local_1e8._6_2_;
          local_188._8_8_ = plVar14;
          trb_print_subtree_nodes(node,(uint32_t)local_1f0,wr_03,ca_06,pc,tc);
          goto LAB_001984f8;
        }
      }
      ly_print_(pc->out,"\n");
      wr_01._20_4_ = wr._20_4_;
      wr_01.actual_pos = wr.actual_pos;
      wr_01.bit_marks1 = wr.bit_marks1;
      wr_01.type = wr.type;
      wr_01._4_4_ = wr._4_4_;
      ca_05.last_list = plVar12;
      ca_05.ancestor = (undefined4)local_1e8;
      ca_05.lys_status = local_1e8._4_2_;
      ca_05.lys_config = local_1e8._6_2_;
      trb_print_subtree_nodes(node,(uint32_t)local_1f0,wr_01,ca_05,pc,tc);
    }
LAB_001984f8:
    tVar23.last_list = plVar12;
    tVar23.ancestor = (undefined4)local_1e8;
    tVar23.lys_status = local_1e8._4_2_;
    tVar23.lys_config = local_1e8._6_2_;
    (*(pc->fp).modify.next_sibling)((trt_node *)local_188,tVar23,tc);
    ptVar18 = (trt_node *)local_188;
    ptVar19 = node;
    for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
      ptVar19->status = ptVar18->status;
      ptVar18 = (trt_node *)((long)ptVar18 + (ulong)bVar21 * -0x10 + 8);
      ptVar19 = (trt_node *)((long)ptVar19 + (ulong)bVar21 * -0x10 + 8);
    }
    if ((((node->iffeatures).type == TRD_IFF_NON_PRESENT) && ((node->type).type == TRD_TYPE_EMPTY))
       && (((node->name).str == (char *)0x0 &&
           ((node->flags == (char *)0x0 && (node->status == (char *)0x0)))))) {
      (*(pc->fp).modify.parent)(tc);
      return;
    }
  } while( true );
LAB_0019838d:
  tc->last_error = LVar8;
  goto LAB_00198391;
code_r0x00198234:
  trm_reset_tree_ctx_by_plugin(&local_1a8,(uint64_t)i_00,pc,tc);
  i_00 = i_00 + 1;
  if (bVar3 && bVar4) {
    if (local_1a8.schemas == (lyspr_tree_schema *)0x0) {
      p_Var11 = (lyplg_ext_sprinter_ctree_override_clb)0x0;
    }
    else {
      p_Var11 = local_1a8.schemas[-1].field_2.cn_overr;
    }
    bVar20 = i_00 == p_Var11;
  }
  else {
    bVar20 = false;
  }
  (tc->plugin_ctx).last_schema = bVar20;
  local_f8.name.opts = (char *)0x0;
  local_f8.name.str = (char *)0x0;
  local_f8.name.add_opts = (char *)0x0;
  local_f8.name.type = TRD_NODE_ELSE;
  local_f8.name.keys = '\0';
  local_f8.name._5_3_ = 0;
  local_f8.name.module_prefix = (char *)0x0;
  local_f8.status = (char *)0x0;
  local_f8.flags = (char *)0x0;
  local_f8.type.type = TRD_TYPE_EMPTY;
  local_f8.type.str = (char *)0x0;
  local_f8.iffeatures.type = TRD_IFF_NON_PRESENT;
  local_f8.iffeatures.str = (char *)0x0;
  local_f8.last_one = '\x01';
  wr_00._20_4_ = uStack_fc;
  wr_00.actual_pos = local_100;
  wr_00.bit_marks1 = uStack_108;
  wr_00._0_8_ = local_118._8_8_;
  ca_04.last_list = local_1d0;
  ca_04.ancestor = (uint32_t)local_1f0;
  ca_04.lys_status = local_1f0._4_2_;
  ca_04.lys_config = local_1f0._6_2_;
  trb_print_subtree_nodes(&local_f8,uVar9,wr_00,ca_04,pc,tc);
  puVar17 = (undefined8 *)local_188;
  ptVar15 = tc;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar1 = *puVar17;
    ptVar15->lysc_tree = (char)uVar1;
    *(int3 *)&ptVar15->field_0x1 = (int3)((ulong)uVar1 >> 8);
    ptVar15->section = (int)((ulong)uVar1 >> 0x20);
    puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    ptVar15 = (trt_tree_ctx *)((long)ptVar15 + (ulong)bVar21 * -0x10 + 8);
  }
  if (local_1a8.schemas == (lyspr_tree_schema *)0x0) goto LAB_0019831b;
  goto LAB_0019822a;
}

Assistant:

static void
trb_print_subtree_nodes(struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    if (!trp_node_is_empty(node)) {
        /* Print root node. */
        trb_print_entire_node(node, max_gap_before_type, wr, pc, tc);
        if (trp_ext_is_present_in_node(tc)) {
            trb_ext_print_instances(wr, ca, pc, tc);
        }
        /* if node is last sibling, then do not add '|' to wrapper */
        wr = trb_node_is_last_sibling(&pc->fp, tc) ?
                trp_wrapper_set_shift(wr) : trp_wrapper_set_mark(wr);
        /* go to the child */
        ca = tro_parent_cache_for_child(ca, tc);
        *node = pc->fp.modify.next_child(ca, tc);
        if (trp_node_is_empty(node)) {
            return;
        }
        /* TODO comment browse through instances + filtered. try unified indentation for children */
        max_gap_before_type = trb_try_unified_indent(ca, pc, tc);
    } else {
        /* Root node is ignored, continue with child. */
        *node = pc->fp.modify.first_sibling(ca, tc);
    }

    do {
        if (!tc->plugin_ctx.filtered && !trb_need_implicit_node_case(tc)) {
            /* normal behavior */
            ly_print_(pc->out, "\n");
            trb_print_subtree_nodes(node, max_gap_before_type, wr, ca, pc, tc);
        } else if (!tc->plugin_ctx.filtered) {
            struct trt_wrapper wr_case_child;

            wr_case_child = trb_print_implicit_node(node, wr, pc, tc);
            trb_print_subtree_nodes(node, max_gap_before_type, wr_case_child, ca, pc, tc);
        }
        /* go to the actual node's sibling */
        *node = pc->fp.modify.next_sibling(ca, tc);
    } while (!trp_node_is_empty(node));

    /* get back from child node to root node */
    pc->fp.modify.parent(tc);
}